

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.hpp
# Opt level: O1

void __thiscall
ft::list<ft::pair<int,_int>,_ft::allocator<ft::pair<int,_int>_>_>::listInit
          (list<ft::pair<int,_int>,_ft::allocator<ft::pair<int,_int>_>_> *this)

{
  listNode<ft::pair<int,_int>_> *plVar1;
  node *pnVar2;
  
  pnVar2 = (node *)operator_new(0x18);
  this->m_head = pnVar2;
  pnVar2 = (node *)operator_new(0x18);
  this->m_tail = pnVar2;
  plVar1 = this->m_head;
  (plVar1->data).first = 0;
  (plVar1->data).second = 0;
  (plVar1->data).second = 0;
  plVar1->prev = (listNode<ft::pair<int,_int>_> *)0x0;
  plVar1->next = (listNode<ft::pair<int,_int>_> *)0x0;
  (pnVar2->data).first = 0;
  (pnVar2->data).second = 0;
  (pnVar2->data).second = 0;
  pnVar2->prev = (listNode<ft::pair<int,_int>_> *)0x0;
  pnVar2->next = (listNode<ft::pair<int,_int>_> *)0x0;
  plVar1->next = pnVar2;
  pnVar2->prev = plVar1;
  return;
}

Assistant:

void listInit() {
		this->m_head = this->m_alloc.allocate(1);
		this->m_tail = this->m_alloc.allocate(1);
		this->m_alloc.construct(this->m_head, node());
		this->m_alloc.construct(this->m_tail, node());
		this->head()->next = this->tail();
		this->tail()->prev = this->head();
	}